

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

ly_bool lysp_schema_nodeid_match
                  (lysc_nodeid *nodeid,lysp_module *nodeid_pmod,lysp_ext_instance *nodeid_ext,
                  lysc_node *ctx_node,lysc_node *parent,lysp_node *pnode,lys_module *pnode_mod,
                  lysc_ext_instance *pnode_ext)

{
  ly_bool lVar1;
  lys_module *plVar2;
  lys_module *mod;
  uint32_t i;
  lysp_node *pnode_local;
  lysc_node *parent_local;
  lysc_node *ctx_node_local;
  lysp_ext_instance *nodeid_ext_local;
  lysp_module *nodeid_pmod_local;
  lysc_nodeid *nodeid_local;
  
  if (((nodeid_ext == (lysp_ext_instance *)0x0) || (pnode_ext != (lysc_ext_instance *)0x0)) &&
     ((nodeid_ext != (lysp_ext_instance *)0x0 || (pnode_ext == (lysc_ext_instance *)0x0)))) {
    mod._4_4_ = nodeid->count - 1;
    pnode_local = (lysp_node *)parent;
    parent_local = ctx_node;
    ctx_node_local = (lysc_node *)nodeid_ext;
    nodeid_ext_local = (lysp_ext_instance *)nodeid_pmod;
    nodeid_pmod_local = (lysp_module *)nodeid;
    plVar2 = lys_schema_node_get_module(nodeid_pmod->mod->ctx,nodeid->prefix[mod._4_4_],nodeid_pmod)
    ;
    if (plVar2 == (lys_module *)0x0) {
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                    ,0x699,
                    "ly_bool lysp_schema_nodeid_match(const struct lysc_nodeid *, const struct lysp_module *, const struct lysp_ext_instance *, const struct lysc_node *, const struct lysc_node *, const struct lysp_node *, const struct lys_module *, const struct lysc_ext_instance *)"
                   );
    }
    if (pnode == (lysp_node *)0x0) {
      lVar1 = lysp_schema_nodeid_match_node
                        ((lysc_node **)&pnode_local,plVar2,
                         *(char **)(nodeid_pmod_local->imports->rev + (ulong)mod._4_4_ * 8 + -0x32))
      ;
      if (lVar1 == '\0') {
        return '\0';
      }
    }
    else if ((pnode_mod != plVar2) ||
            (pnode->name !=
             *(char **)(nodeid_pmod_local->imports->rev + (ulong)mod._4_4_ * 8 + -0x32))) {
      return '\0';
    }
    do {
      while( true ) {
        if (mod._4_4_ == 0) {
          if ((parent_local != (lysc_node *)0x0) && (parent_local != (lysc_node *)pnode_local)) {
            return '\0';
          }
          if ((parent_local == (lysc_node *)0x0) &&
             ((pnode_local != (lysp_node *)0x0 || (pnode_ext != (lysc_ext_instance *)0x0)))) {
            return '\0';
          }
          return '\x01';
        }
        mod._4_4_ = mod._4_4_ - 1;
        if ((pnode_local == (lysp_node *)0x0) && (pnode_ext == (lysc_ext_instance *)0x0)) {
          return '\0';
        }
        plVar2 = lys_schema_node_get_module
                           (*(ly_ctx **)nodeid_ext_local->name,
                            *(char **)(nodeid_pmod_local->revs->date + (ulong)mod._4_4_ * 8),
                            (lysp_module *)nodeid_ext_local);
        if (plVar2 == (lys_module *)0x0) {
          __assert_fail("mod",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x6b2,
                        "ly_bool lysp_schema_nodeid_match(const struct lysc_nodeid *, const struct lysp_module *, const struct lysp_ext_instance *, const struct lysc_node *, const struct lysc_node *, const struct lysp_node *, const struct lys_module *, const struct lysc_ext_instance *)"
                       );
        }
        if (pnode_local == (lysp_node *)0x0) break;
        lVar1 = lysp_schema_nodeid_match_node
                          ((lysc_node **)&pnode_local,plVar2,
                           *(char **)(nodeid_pmod_local->imports->rev + (ulong)mod._4_4_ * 8 + -0x32
                                     ));
        if (lVar1 == '\0') {
          return '\0';
        }
      }
      lVar1 = lysp_schema_nodeid_match_ext
                        (&pnode_ext,plVar2,
                         *(char **)(nodeid_pmod_local->imports->rev + (ulong)mod._4_4_ * 8 + -0x32))
      ;
    } while (lVar1 != '\0');
  }
  return '\0';
}

Assistant:

static ly_bool
lysp_schema_nodeid_match(const struct lysc_nodeid *nodeid, const struct lysp_module *nodeid_pmod,
        const struct lysp_ext_instance *nodeid_ext, const struct lysc_node *ctx_node, const struct lysc_node *parent,
        const struct lysp_node *pnode, const struct lys_module *pnode_mod, const struct lysc_ext_instance *pnode_ext)
{
    uint32_t i;
    const struct lys_module *mod;

    if (nodeid_ext && !pnode_ext) {
        /* extension instance augment and standard node, will never match */
        return 0;
    } else if (!nodeid_ext && pnode_ext) {
        /* standard augment and extension instance node, will never match */
        return 0;
    }

    /* compare last node in the node ID */
    i = nodeid->count - 1;

    /* get exp node ID module */
    mod = lys_schema_node_get_module(nodeid_pmod->mod->ctx, nodeid->prefix[i], nodeid_pmod);
    assert(mod);

    if (pnode) {
        /* compare on the last parsed-only node */
        if ((pnode_mod != mod) || (pnode->name != nodeid->name[i])) {
            return 0;
        }
    } else {
        /* using parent directly */
        if (!lysp_schema_nodeid_match_node(&parent, mod, nodeid->name[i])) {
            return 0;
        }
    }

    /* now compare all the compiled parents */
    while (i) {
        --i;

        if (!parent && !pnode_ext) {
            /* no more parents but path continues */
            return 0;
        }

        /* get exp node ID module */
        mod = lys_schema_node_get_module(nodeid_pmod->mod->ctx, nodeid->prefix[i], nodeid_pmod);
        assert(mod);

        if (parent) {
            /* compare with the parent */
            if (!lysp_schema_nodeid_match_node(&parent, mod, nodeid->name[i])) {
                return 0;
            }
        } else {
            /* compare with the ext instance */
            if (!lysp_schema_nodeid_match_ext(&pnode_ext, mod, nodeid->name[i])) {
                return 0;
            }
        }
    }

    if (ctx_node && (ctx_node != parent)) {
        /* descendant path has not finished in the context node */
        return 0;
    } else if (!ctx_node && (parent || pnode_ext)) {
        /* some parent/extension was not matched */
        return 0;
    }

    return 1;
}